

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic-base.hxx
# Opt level: O0

Solution *
lineage::heuristics::
applyHeuristic<lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,std::allocator<double>>>>
          (ProblemGraph *problemGraph,double costTermination,double costBirth,
          bool enforceBifurcationConstraint,string *solutionName,size_t maxIter)

{
  bool bVar1;
  Problem *pPVar2;
  Data *in_RCX;
  byte in_DL;
  ProblemGraph *in_RSI;
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *in_RDI;
  size_t in_R8;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> search;
  Edge e;
  const_iterator __end2;
  const_iterator __begin2;
  vector<lineage::Edge,_std::allocator<lineage::Edge>_> *__range2;
  Data data;
  ofstream file;
  Solution *solution;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb88;
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffb90;
  value_type_conflict4 *in_stack_fffffffffffffb98;
  Timer *in_stack_fffffffffffffba0;
  ProblemGraph *in_stack_fffffffffffffba8;
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *this;
  const_iterator __position;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> *in_stack_fffffffffffffc28;
  __normal_iterator<const_lineage::Edge_*,_std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>_>
  local_2e8;
  vector<lineage::Edge,_std::allocator<lineage::Edge>_> *local_2e0;
  double local_2d0;
  double local_2c8;
  undefined1 local_2b8 [96];
  string local_258 [32];
  ostream local_238 [512];
  size_t local_38;
  byte local_21;
  double local_20;
  double local_18;
  ProblemGraph *local_10;
  
  local_18 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_20 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_21 = in_DL & 1;
  __position._M_current = (double *)local_258;
  this = in_RDI;
  local_38 = in_R8;
  local_10 = in_RSI;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (char *)in_RCX);
  std::ofstream::ofstream(local_238,(string *)__position._M_current,_S_out);
  std::__cxx11::string::~string(local_258);
  std::operator<<(local_238,
                  "time objBound objBest gap nSpaceCycle nSpaceTime nMorality nTermination nBirth nBifurcation objValue time_separation\n"
                 );
  std::ofstream::close();
  std::ofstream::~ofstream(local_238);
  Data::Data(in_RCX,in_stack_fffffffffffffba8);
  local_2c8 = local_20;
  local_2d0 = local_18;
  local_2b8[0x18] = local_21 & 1;
  std::__cxx11::string::operator=((string *)(local_2b8 + 0x20),(string *)in_RCX);
  pPVar2 = ProblemGraph::problem(local_10);
  local_2e0 = &pPVar2->edges;
  local_2e8._M_current =
       (Edge *)std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>::begin
                         ((vector<lineage::Edge,_std::allocator<lineage::Edge>_> *)
                          in_stack_fffffffffffffb88);
  std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>::end
            ((vector<lineage::Edge,_std::allocator<lineage::Edge>_> *)in_stack_fffffffffffffb88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_lineage::Edge_*,_std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>_>
                             *)in_stack_fffffffffffffb90,
                            (__normal_iterator<const_lineage::Edge_*,_std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>_>
                             *)in_stack_fffffffffffffb88), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_lineage::Edge_*,_std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>_>
    ::operator*(&local_2e8);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffba0,
               in_stack_fffffffffffffb98);
    __gnu_cxx::
    __normal_iterator<const_lineage::Edge_*,_std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>_>
    ::operator++(&local_2e8);
  }
  if (0.0 < local_18) {
    in_stack_fffffffffffffba0 = (Timer *)local_2b8;
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffb88);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffb90,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffb88);
    ProblemGraph::graph(local_10);
    andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfVertices
              ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x149d04);
    std::vector<double,_std::allocator<double>_>::insert
              ((vector<double,_std::allocator<double>_> *)this,__position,(size_type)in_RDI,
               (value_type_conflict4 *)in_RCX);
  }
  if (0.0 < local_20) {
    in_stack_fffffffffffffb90 =
         (GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *)local_2b8;
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffb88);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffb90,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffb88);
    ProblemGraph::graph(local_10);
    andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfVertices
              ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x149d8b);
    std::vector<double,_std::allocator<double>_>::insert
              ((vector<double,_std::allocator<double>_> *)this,__position,(size_type)in_RDI,
               (value_type_conflict4 *)in_RCX);
  }
  levinkov::Timer::start((Timer *)in_stack_fffffffffffffb90);
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::
  GreedyLineageAgglomeration(this,(Data *)in_RDI);
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::setMaxIter
            ((GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *)
             &stack0xfffffffffffffbd8,local_38);
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::optimize
            ((GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *)
             CONCAT17(in_stack_fffffffffffffbd7,in_stack_fffffffffffffbd0));
  DynamicLineage<std::vector<double,_std::allocator<double>_>_>::getSolution
            (in_stack_fffffffffffffc28);
  levinkov::Timer::stop(in_stack_fffffffffffffba0);
  postOptimizationChecks<lineage::Data,lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,std::allocator<double>>>,lineage::Solution>
            ((Data *)search.super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>.
                     partition_.ranks_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,
             (GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *)
             search.super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>.partition_.
             parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             (Solution *)
             search.super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>.partition_.
             parents_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish);
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::
  ~GreedyLineageAgglomeration(in_stack_fffffffffffffb90);
  Data::~Data((Data *)in_stack_fffffffffffffb90);
  return (Solution *)this;
}

Assistant:

Solution
applyHeuristic(ProblemGraph const& problemGraph, double costTermination = .0,
               double costBirth = .0, bool enforceBifurcationConstraint = false,
               std::string solutionName = "heuristic", size_t maxIter = 500)
{

    // create log file/replace existing log file with empty log file
    {
        std::ofstream file(solutionName + "-optimization-log.txt");
        file << "time objBound objBest gap nSpaceCycle nSpaceTime nMorality "
                "nTermination nBirth nBifurcation objValue time_separation\n";
        file.close();
    }

    Data data(problemGraph);
    data.costBirth = costBirth;
    data.costTermination = costTermination;
    data.enforceBifurcationConstraint = enforceBifurcationConstraint;
    data.solutionName = solutionName;

    // define costs
    for (auto e : problemGraph.problem().edges)
        data.costs.push_back(e.weight);

    if (costTermination > 0.0)
        data.costs.insert(data.costs.end(),
                          problemGraph.graph().numberOfVertices(),
                          costTermination);

    if (costBirth > 0.0)
        data.costs.insert(data.costs.end(),
                          problemGraph.graph().numberOfVertices(), costBirth);

    data.timer.start();
    auto search = OPTIMIZER(data);
    search.setMaxIter(maxIter);

    search.optimize();
    const auto solution = search.getSolution();
    data.timer.stop();

    postOptimizationChecks(data, search, solution);

    return solution;
}